

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr_playground.cpp
# Opt level: O3

int main(void)

{
  MyClass *pMVar1;
  ostream *poVar2;
  shared_ptr_t<MyClass> s_ptr;
  shared_ptr<MyClass> local_38;
  shared_ptr<MyClass> local_28;
  
  pMVar1 = (MyClass *)operator_new(4);
  MyClass::MyClass(pMVar1,10);
  estl::shared_ptr<MyClass>::shared_ptr(&local_38,pMVar1);
  local_28.ptr_ = local_38.ptr_;
  local_28.control_block_ptr_ = local_38.control_block_ptr_;
  estl::shared_ptr<MyClass>::increase_counters(&local_28);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"mc1.use_clount(2) : ",0x14);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,",  mc1.value: ",0xe);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(local_38.ptr_)->val_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"mc2.use_count(2) : ",0x13);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,",  mc2.value: ",0xe);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(local_28.ptr_)->val_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  pMVar1 = (MyClass *)operator_new(4);
  MyClass::MyClass(pMVar1,0x14);
  estl::shared_ptr<MyClass>::reset(&local_38,pMVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"mc1.use_count(1) : ",0x13);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,",  mc1.value: ",0xe);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(local_38.ptr_)->val_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"mc2.use_count(1) : ",0x13);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,",  mc2.value: ",0xe);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(local_28.ptr_)->val_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  estl::shared_ptr<MyClass>::decrease_counters(&local_28);
  estl::shared_ptr<MyClass>::decrease_counters(&local_38);
  pMVar1 = (MyClass *)operator_new(4);
  MyClass::MyClass(pMVar1);
  estl::shared_ptr<MyClass>::shared_ptr(&local_38,pMVar1);
  estl::shared_ptr<MyClass>::decrease_counters(&local_38);
  return 0;
}

Assistant:

int main()
{

    {
        shared_ptr_t<MyClass> mc1 = shared_ptr_t<MyClass>(new MyClass(10));
        auto mc2 = mc1;
        cerr << "mc1.use_clount(2) : " << mc1.use_count() << ",  mc1.value: " << mc1->val() <<  "\n";
        cerr << "mc2.use_count(2) : " << mc2.use_count() << ",  mc2.value: " << mc2->val() <<  "\n";
        mc1.reset(new MyClass(20));
        cerr << "mc1.use_count(1) : " << mc1.use_count() << ",  mc1.value: " << mc1->val() <<  "\n";
        cerr << "mc2.use_count(1) : " << mc2.use_count() << ",  mc2.value: " << mc2->val() <<  "\n";
    }

    shared_ptr_t<MyClass> s_ptr = shared_ptr_t<MyClass>(new MyClass());
    return 0;
}